

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

int AnalyzeOpcode(PDISASM pMyDisasm)

{
  byte *pbVar1;
  int iVar2;
  UInt8 *opcode;
  PDISASM pMyDisasm_local;
  
  iVar2 = Security(1,pMyDisasm);
  if (iVar2 != 0) {
    pbVar1 = (byte *)(pMyDisasm->Reserved_).EIP_;
    (pMyDisasm->Instruction).Opcode = (uint)*pbVar1;
    (*opcode_map1[*pbVar1])(pMyDisasm);
  }
  pMyDisasm_local._4_4_ = (uint)(iVar2 != 0);
  return pMyDisasm_local._4_4_;
}

Assistant:

int __bea_callspec__ AnalyzeOpcode (PDISASM pMyDisasm)
{
  UInt8 *opcode;
  if (!Security(1, pMyDisasm)) return 0;
  opcode = (UInt8*) GV.EIP_;
  pMyDisasm->Instruction.Opcode = *opcode;
  (void) opcode_map1[*opcode](pMyDisasm);
  return 1;
}